

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bundle.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Bundle::AddPDU(Bundle *this,PduPtr *H)

{
  KUINT16 KVar1;
  Header6 *this_00;
  KException *this_01;
  allocator<char> local_39;
  KString local_38;
  PduPtr *local_18;
  PduPtr *H_local;
  Bundle *this_local;
  
  local_18 = H;
  H_local = (PduPtr *)this;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
  ::push_back(&this->m_vRefHeaders,H);
  this_00 = &UTILS::KRef_Ptr<KDIS::PDU::Header7>::operator->(H)->super_Header6;
  KVar1 = Header6::GetPDULength(this_00);
  this->m_ui16Length = this->m_ui16Length + KVar1;
  if (0x2000 < this->m_ui16Length) {
    this_01 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"AddPDU",&local_39);
    KException::KException(this_01,&local_38,0xb);
    __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
  }
  return;
}

Assistant:

void Bundle::AddPDU(PduPtr H) noexcept(false)
{
    m_vRefHeaders.push_back( H );
    m_ui16Length += H->GetPDULength();
    if( m_ui16Length > MAX_PDU_SIZE )throw KException( __FUNCTION__, PDU_TOO_LARGE );
}